

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::SetupProperties(SMDImporter *this,Importer *pImp)

{
  bool bVar1;
  uint uVar2;
  Importer *pImp_local;
  SMDImporter *this_local;
  
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_SMD_KEYFRAME",-1);
  this->configFrameID = uVar2;
  if (this->configFrameID == 0xffffffff) {
    uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar2;
  }
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_SMD_LOAD_ANIMATION_LIST",true);
  this->bLoadAnimationList = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_NO_SKELETON_MESHES",false);
  this->noSkeletonMesh = bVar1;
  return;
}

Assistant:

void SMDImporter::SetupProperties(const Importer* pImp) {
    // The
    // AI_CONFIG_IMPORT_SMD_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_SMD_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    bLoadAnimationList = pImp->GetPropertyBool(AI_CONFIG_IMPORT_SMD_LOAD_ANIMATION_LIST, true);
    noSkeletonMesh = pImp->GetPropertyBool(AI_CONFIG_IMPORT_NO_SKELETON_MESHES, false);
}